

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

int cmSystemTools::strverscmp(char *__s1,char *__s2)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  char cVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  
  lVar6 = *(long *)__s1;
  lVar7 = *(long *)__s2;
  uVar13 = 0xfffffffffffffffe;
  do {
    uVar12 = uVar13;
    cVar4 = *(char *)(lVar6 + 2 + uVar12);
    cVar5 = *(char *)(lVar7 + 2 + uVar12);
    uVar13 = uVar12 + 1;
    if (cVar4 == '\0') break;
  } while (cVar4 == cVar5);
  if (cVar4 == cVar5) goto LAB_0039543c;
  lVar14 = uVar12 + 2;
  if (uVar13 != 0xffffffffffffffff) {
    do {
      if (9 < (int)*(char *)(lVar6 + -1 + lVar14) - 0x30U) goto LAB_003953a1;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
    lVar14 = 0;
  }
LAB_003953a1:
  if (uVar13 - lVar14 == -1) {
    uVar1 = (int)cVar4 - 0x30;
    uVar10 = (ulong)uVar1;
    bVar17 = true;
    if ((uVar1 < 10) && ((int)cVar5 - 0x30U < 10)) goto LAB_003953c2;
  }
  else {
LAB_003953c2:
    uVar8 = 0;
    do {
      uVar10 = uVar8;
      if (*(char *)(lVar14 + lVar6 + uVar10) != '0') break;
      uVar8 = uVar10 + 1;
    } while ((int)*(char *)(lVar14 + lVar6 + 1 + uVar10) - 0x30U < 10);
    uVar8 = 0;
    uVar9 = uVar10;
    do {
      uVar15 = uVar9;
      uVar11 = uVar8;
      if (*(char *)(lVar14 + lVar7 + uVar11) != '0') break;
      uVar8 = uVar11 + 1;
      uVar9 = uVar15 - 1;
    } while ((int)*(char *)(lVar14 + lVar7 + 1 + uVar11) - 0x30U < 10);
    if (uVar15 == 0) {
      if (uVar10 != 0) {
        bVar17 = true;
        goto LAB_00395437;
      }
      lVar14 = 0;
      do {
        lVar2 = lVar6 + lVar14;
        lVar14 = lVar14 + 1;
      } while ((int)*(char *)(uVar12 + 2 + lVar2) - 0x30U < 10);
      uVar12 = uVar13 + lVar14;
      do {
        pcVar3 = (char *)(lVar7 + 1 + uVar13);
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + -1;
      } while ((int)*pcVar3 - 0x30U < 10);
      bVar17 = lVar14 == 0;
      bVar16 = uVar13 < uVar12;
    }
    else {
      bVar17 = false;
      bVar16 = uVar10 < uVar11;
    }
    uVar10 = (ulong)(bVar16 - 1 | 1);
  }
LAB_00395437:
  if (!bVar17) {
    return (int)uVar10;
  }
LAB_0039543c:
  return (int)cVar4 - (int)cVar5;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = "[";
    reg += key + "]";
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}